

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

int lj_opt_fwd_href_nokey(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  AliasRet AVar3;
  ushort uVar4;
  
  uVar1 = (J->fold).ins.field_0.op1;
  if ((((J->fold).right[0].field_1.t.irt & 0x1f) == 0xe) && (uVar1 < J->chain[0x3b])) {
    for (uVar4 = J->chain[0x4a]; uVar1 < uVar4;
        uVar4 = *(ushort *)((long)(J->cur).ir + (ulong)uVar4 * 8 + 6)) {
      if (uVar4 < J->chain[0x3b]) {
        return 0;
      }
    }
  }
  uVar4 = J->chain[0x4b];
  if (uVar1 < uVar4) {
    pIVar2 = (J->cur).ir;
    do {
      AVar3 = aa_ahref(J,&(J->fold).ins,pIVar2 + pIVar2[uVar4].field_0.op1);
      if (AVar3 != ALIAS_NO) {
        return 0;
      }
      uVar4 = *(ushort *)((long)pIVar2 + (ulong)uVar4 * 8 + 6);
    } while (uVar1 < uVar4);
  }
  return 1;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_href_nokey(jit_State *J)
{
  IRRef lim = fins->op1;  /* Search limit. */
  IRRef ref;

  /* The key for an ASTORE may end up in the hash part after a NEWREF. */
  if (irt_isnum(fright->t) && J->chain[IR_NEWREF] > lim) {
    ref = J->chain[IR_ASTORE];
    while (ref > lim) {
      if (ref < J->chain[IR_NEWREF])
	return 0;  /* Conflict. */
      ref = IR(ref)->prev;
    }
  }

  /* Search for conflicting stores. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    if (aa_ahref(J, fins, IR(store->op1)) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = store->prev;
  }

  return 1;  /* No conflict. Can fold to niltv. */
}